

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_Constructor_type_witver_Test::~AddressFactory_Constructor_type_witver_Test
          (AddressFactory_Constructor_type_witver_Test *this)

{
  void *in_RDI;
  
  ~AddressFactory_Constructor_type_witver_Test
            ((AddressFactory_Constructor_type_witver_Test *)0x1a5dc8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type_witver)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet, WitnessVersion::kVersion0));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet, WitnessVersion::kVersion1));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest, WitnessVersion::kVersionNone));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kLiquidV1, WitnessVersion::kVersion0));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kElementsRegtest, WitnessVersion::kVersionNone));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");

  {
    AddressFactory factory(NetType::kMainnet, WitnessVersion::kVersion0);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet, WitnessVersion::kVersion1);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kRegtest, WitnessVersion::kVersionNone);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kLiquidV1, WitnessVersion::kVersion0);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest, WitnessVersion::kVersionNone);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
}